

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_piece_util_test.cc
# Opt level: O1

Test * StringPieceUtilTestEqualsCaseInsensitiveASCII::Create(void)

{
  g_current_test = (Test *)operator_new(0x10);
  g_current_test->failed_ = false;
  g_current_test->assertion_failures_ = 0;
  g_current_test->_vptr_Test = (_func_int **)&PTR__Test_001d8340;
  return g_current_test;
}

Assistant:

TEST(StringPieceUtilTest, EqualsCaseInsensitiveASCII) {
  EXPECT_TRUE(EqualsCaseInsensitiveASCII("abc", "abc"));
  EXPECT_TRUE(EqualsCaseInsensitiveASCII("abc", "ABC"));
  EXPECT_TRUE(EqualsCaseInsensitiveASCII("abc", "aBc"));
  EXPECT_TRUE(EqualsCaseInsensitiveASCII("AbC", "aBc"));
  EXPECT_TRUE(EqualsCaseInsensitiveASCII("", ""));

  EXPECT_FALSE(EqualsCaseInsensitiveASCII("a", "ac"));
  EXPECT_FALSE(EqualsCaseInsensitiveASCII("/", "\\"));
  EXPECT_FALSE(EqualsCaseInsensitiveASCII("1", "10"));
}